

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  long lVar1;
  ulong c;
  ctrl_t *pcVar2;
  bool bVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  size_t hash;
  size_t sVar7;
  undefined8 uVar8;
  ctrl_t cVar9;
  ulong uVar10;
  FindInfo FVar11;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_40 = common->capacity_;
    local_38 = (byte)common->size_ & 1;
    local_37 = 0;
    local_50.heap.control = (common->heap_or_soo_).heap.control;
    local_50.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,32ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,0x18,0x20);
    if (local_40 != 0) {
      if (bVar3) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,void>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
                  ((HashSetResizeHelper *)&local_50.heap,common,
                   (allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_> *)
                   common);
      }
      else {
        if ((char)local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          lVar1 = *(long *)((long)&common->heap_or_soo_ + 8);
          sVar7 = 0;
          uVar8 = local_50.heap.slot_array;
          do {
            if ((char)local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar7]) {
              uVar4 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,*(long *)uVar8,
                                 *(long *)(uVar8 + 8) - *(long *)uVar8);
              uVar10 = (*(long *)(uVar8 + 8) - *(long *)uVar8 >> 2 ^ uVar4) * -0x234dd359734ecb13;
              FVar11 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8
                                   | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38),hash);
              uVar5 = FVar11.offset;
              c = common->capacity_;
              if (c <= uVar5) {
                __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x744,
                              "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                             );
              }
              cVar9 = (ctrl_t)(uVar10 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar5] = cVar9;
              pcVar2[(ulong)((uint)c & 0xf) + (uVar5 - 0xf & c)] = cVar9;
              lVar6 = uVar5 * 0x20;
              common->capacity_ = 0xffffffffffffff9c;
              *(long *)(lVar1 + lVar6) = *(long *)uVar8;
              *(long *)(lVar1 + 8 + lVar6) = *(long *)(uVar8 + 8);
              *(long *)(lVar1 + 0x10 + lVar6) = *(long *)(uVar8 + 0x10);
              *(long *)uVar8 = 0;
              *(long *)(uVar8 + 8) = 0;
              *(long *)(uVar8 + 0x10) = 0;
              *(undefined4 *)(lVar1 + 0x18 + lVar6) = *(undefined4 *)(uVar8 + 0x18);
              CommonFields::set_capacity(common,c);
            }
            sVar7 = sVar7 + 1;
            uVar8 = uVar8 + 0x20;
          } while (sVar7 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_50,&local_52,0x20);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, int>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, int>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }